

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O1

err_t cmdCVCsCount(size_t *count,octet *certs,size_t certs_len)

{
  size_t sVar1;
  
  *count = 0;
  if (certs_len != 0) {
    do {
      sVar1 = btokCVCLen(certs,certs_len);
      if (sVar1 == 0xffffffffffffffff) {
        return 0x204;
      }
      certs = certs + sVar1;
      *count = *count + 1;
      certs_len = certs_len - sVar1;
    } while (certs_len != 0);
  }
  return 0;
}

Assistant:

err_t cmdCVCsCount(size_t* count, const octet* certs, size_t certs_len)
{
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsValid(count, O_PER_S));
	// цикл по сертификатам
	for (*count = 0; certs_len; ++*count)
	{
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			return ERR_BAD_CERTRING;
		certs += len, certs_len -= len;
	}
	return ERR_OK;
}